

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

Element * Rml::ElementUtilities::GetElementById(Element *root_element,String *id)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  reference ppEVar5;
  String *__lhs;
  Element *local_98;
  int local_90;
  undefined4 local_8c;
  int i;
  Element *element;
  undefined1 local_70 [8];
  SearchQueue search_queue;
  String *id_local;
  Element *root_element_local;
  
  search_queue.c.super__Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)id;
  id_local = (String *)root_element;
  ::std::queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>>::
  queue<std::deque<Rml::Element*,std::allocator<Rml::Element*>>,void>
            ((queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>> *)
             local_70);
  ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::push
            ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
             local_70,(value_type *)&id_local);
  do {
    bVar2 = ::std::
            queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
            empty((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                   *)local_70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      root_element_local = (Element *)0x0;
LAB_005985a8:
      local_8c = 1;
      ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
      ~queue((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
             local_70);
      return root_element_local;
    }
    ppEVar5 = ::std::
              queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
              front((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                     *)local_70);
    _i = *ppEVar5;
    ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::pop
              ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                *)local_70);
    __lhs = Element::GetId_abi_cxx11_(_i);
    _Var3 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)search_queue.c.
                                       super__Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (_Var3) {
      root_element_local = _i;
      goto LAB_005985a8;
    }
    for (local_90 = 0; iVar1 = local_90, iVar4 = Element::GetNumChildren(_i,false), iVar1 < iVar4;
        local_90 = local_90 + 1) {
      local_98 = Element::GetChild(_i,local_90);
      ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
      push((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
           local_70,&local_98);
    }
  } while( true );
}

Assistant:

Element* ElementUtilities::GetElementById(Element* root_element, const String& id)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	search_queue.push(root_element);

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetId() == id)
		{
			return element;
		}

		// Add all children to search
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}

	return nullptr;
}